

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O3

TRef lj_opt_narrow_unm(jit_State *J,TRef rc,TValue *vc)

{
  IROpT IVar1;
  TRef TVar2;
  ulong uVar3;
  IRRef1 IVar4;
  
  uVar3 = (ulong)rc;
  if ((rc & 0x1f000000) == 0x4000000) {
    (J->fold).ins.field_0.op1 = (IRRef1)rc;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x588e0000;
    TVar2 = lj_opt_fold(J);
    uVar3 = (ulong)TVar2;
    lj_strscan_scan((uint8_t *)((ulong)(vc->u32).lo + 0x10),vc,2);
  }
  if (((uint)(uVar3 >> 0x18) & 0x1f) - 0xf < 5) {
    TVar2 = lj_ir_kint(J,0);
    IVar4 = (IRRef1)TVar2;
    IVar1 = 0x3693;
  }
  else {
    IVar4 = (IRRef1)uVar3;
    TVar2 = lj_ir_k64(J,IR_KNUM,(cTValue *)((ulong)((long)J->ksimd + 0x1fU) & 0xfffffffffffffff0));
    uVar3 = (ulong)TVar2;
    IVar1 = 0x2e0e;
  }
  (J->fold).ins.field_0.ot = IVar1;
  (J->fold).ins.field_0.op1 = IVar4;
  (J->fold).ins.field_0.op2 = (IRRef1)uVar3;
  TVar2 = lj_opt_fold(J);
  return TVar2;
}

Assistant:

TRef lj_opt_narrow_unm(jit_State *J, TRef rc, TValue *vc)
{
  if (tref_isstr(rc)) {
    rc = emitir(IRTG(IR_STRTO, IRT_NUM), rc, 0);
    lj_strscan_num(strV(vc), vc);
  }
  if (tref_isinteger(rc)) {
    if ((uint32_t)numberVint(vc) != 0x80000000u)
      return emitir(IRTGI(IR_SUBOV), lj_ir_kint(J, 0), rc);
    rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
  }
  return emitir(IRTN(IR_NEG), rc, lj_ir_knum_neg(J));
}